

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
ComparisonFailure::ComparisonFailure
          (ComparisonFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *checkString,SimpleString *comparisonString,SimpleString *text)

{
  SimpleString *local_38;
  SimpleString *comparisonString_local;
  SimpleString *checkString_local;
  size_t lineNumber_local;
  char *fileName_local;
  UtestShell *test_local;
  ComparisonFailure *this_local;
  
  local_38 = comparisonString;
  comparisonString_local = checkString;
  checkString_local = (SimpleString *)lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = (char *)test;
  test_local = (UtestShell *)this;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__ComparisonFailure_00189898;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffb8,(SimpleString *)this);
  SimpleString::operator=
            (&(this->super_TestFailure).message_,(SimpleString *)&stack0xffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  SimpleString::operator+=(&(this->super_TestFailure).message_,comparisonString_local);
  SimpleString::operator+=(&(this->super_TestFailure).message_,"(");
  SimpleString::operator+=(&(this->super_TestFailure).message_,local_38);
  SimpleString::operator+=(&(this->super_TestFailure).message_,") failed");
  return;
}

Assistant:

ComparisonFailure::ComparisonFailure(UtestShell *test, const char *fileName, size_t lineNumber, const SimpleString& checkString, const SimpleString &comparisonString, const SimpleString &text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);
    message_ += checkString;
    message_ += "(";
    message_ += comparisonString;
    message_ += ") failed";
}